

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
::split(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
        *this,int insert_position,
       btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
       *dest,allocator_type *alloc)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  bVar1;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  *this_00;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  bVar2;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  bVar3;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  *pbVar4;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  *pbVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  *pbVar6;
  allocator_type *extraout_RDX;
  allocator_type *extraout_RDX_00;
  allocator_type *extraout_RDX_01;
  allocator_type *paVar7;
  allocator_type *extraout_RDX_02;
  allocator_type *extraout_RDX_03;
  uint i;
  allocator_type *in_R9;
  ulong uVar8;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
  *pbVar9;
  size_type i_00;
  long lVar10;
  
  if (((ulong)dest & 7) == 0) {
    if (dest[10] !=
        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
         )0x0) {
      __assert_fail("dest->count() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x8fb,
                    "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>]"
                   );
    }
    if (((ulong)this & 7) == 0) {
      if ((this[0xb] !=
           (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
            )0x0) &&
         (this[0xb] !=
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
           )0x3d)) {
        __assert_fail("max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x8fc,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>]"
                     );
      }
      if (insert_position == 0x3d) {
        bVar2 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                 )0x0;
      }
      else if (insert_position == 0) {
        bVar2 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                 )((char)this[10] - 1);
      }
      else {
        bVar2 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                 )((byte)this[10] >> 1);
      }
      dest[10] = bVar2;
      bVar2 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
               )((char)this[10] - (char)bVar2);
      this[10] = bVar2;
      if (bVar2 == (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                    )0x0) {
        __assert_fail("count() >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x90a,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>]"
                     );
      }
      pbVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                *)0x0;
      uninitialized_move_n(this,(ulong)(byte)dest[10],(ulong)(byte)bVar2,0,dest,in_R9);
      bVar2 = this[10];
      uVar8 = (ulong)(byte)dest[10];
      if (uVar8 != 0) {
        i_00 = (size_type)(byte)bVar2;
        paVar7 = extraout_RDX;
        do {
          value_destroy(this,i_00,paVar7);
          i_00 = i_00 + 1;
          uVar8 = uVar8 - 1;
          paVar7 = extraout_RDX_00;
        } while (uVar8 != 0);
        bVar2 = this[10];
      }
      this[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                  )((char)bVar2 - 1U);
      this_00 = *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                  **)this;
      if (((ulong)this_00 & 7) == 0) {
        bVar3 = *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                  *)(this + 8);
        pbVar9 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                  *)(ulong)(byte)bVar3;
        bVar1 = this_00[10];
        if ((byte)bVar1 < (byte)bVar3) {
          __assert_fail("i <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x852,
                        "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>, Args = <phmap::test_internal::MovableOnlyInstance *>]"
                       );
        }
        if ((byte)bVar3 < (byte)bVar1) {
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
          ::value_init<phmap::test_internal::MovableOnlyInstance*>
                    (this_00,(ulong)(byte)bVar1,
                     (allocator_type *)(this_00 + (ulong)(byte)bVar1 * 0x10),
                     (MovableOnlyInstance **)pbVar6);
          pbVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                    *)(ulong)(byte)this_00[10];
          pbVar4 = pbVar6 + -1;
          paVar7 = extraout_RDX_01;
          if (pbVar9 < pbVar4) {
            pbVar6 = this_00 + (ulong)(byte)this_00[10] * 0x10 + 8;
            do {
              *(undefined8 *)(pbVar6 + -8) = *(undefined8 *)(pbVar6 + -0x18);
              if (*pbVar6 ==
                  (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                   )0x1) {
                test_internal::BaseCountedInstance::num_live_instances_ =
                     test_internal::BaseCountedInstance::num_live_instances_ + -1;
              }
              paVar7 = (allocator_type *)
                       CONCAT71((int7)((ulong)*(undefined8 *)(pbVar6 + -0x18) >> 8),pbVar6[-0x10]);
              *pbVar6 = pbVar6[-0x10];
              pbVar6[-0x10] =
                   (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                    )0x0;
              test_internal::BaseCountedInstance::num_moves_ =
                   test_internal::BaseCountedInstance::num_moves_ + 1;
              pbVar6 = pbVar6 + -0x10;
              pbVar4 = pbVar4 + -1;
            } while (pbVar9 < pbVar4);
          }
          value_destroy((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                         *)this_00,(size_type)pbVar9,paVar7);
        }
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
        ::value_init<phmap::test_internal::MovableOnlyInstance*>
                  (this_00,(size_type)pbVar9,
                   (allocator_type *)(this + (ulong)(byte)((char)bVar2 - 1U) * 0x10 + 0x10),
                   (MovableOnlyInstance **)pbVar6);
        bVar3 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                 )((char)this_00[10] + '\x01');
        this_00[10] = bVar3;
        paVar7 = extraout_RDX_02;
        if (this_00[0xb] ==
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
             )0x0) {
          pbVar9 = pbVar9 + 1;
          pbVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                    *)(ulong)(byte)bVar3;
          if (pbVar9 < (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
                        *)(ulong)(byte)bVar3) {
            do {
              pbVar4 = pbVar6 + -1;
              pbVar5 = child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                              *)this_00,(size_type)pbVar4);
              set_child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                         *)this_00,(size_type)pbVar6,pbVar5);
              pbVar6 = pbVar4;
            } while ((long)pbVar9 < (long)pbVar4);
            mutable_child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                           *)this_00,(size_type)pbVar9);
            paVar7 = extraout_RDX_03;
          }
        }
        value_destroy(this,(ulong)(byte)this[10],paVar7);
        init_child(*(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                     **)this,(byte)this[8] + 1,dest);
        if (this[0xb] ==
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
             )0x0) {
          i = 0xffffffff;
          lVar10 = 1;
          do {
            pbVar5 = child(this,(ulong)(byte)this[10] + lVar10);
            if (pbVar5 == (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                           *)0x0) {
              __assert_fail("child(count() + i + 1) != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x91a,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>]"
                           );
            }
            i = i + 1;
            pbVar5 = child(this,(ulong)(byte)this[10] + lVar10);
            init_child(dest,i,pbVar5);
            mutable_child(this,(ulong)(byte)this[10] + lVar10);
            lVar10 = lVar10 + 1;
          } while (i < (byte)dest[10]);
        }
        return;
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }